

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O0

void __thiscall Bmp::Bmp(Bmp *this,string *file)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *__filename;
  FILE *__stream;
  ulong uVar3;
  BmpColor **ppBVar4;
  ulong uVar5;
  BmpColor *pBVar6;
  BmpColor *local_60;
  int local_40;
  int local_3c;
  int i_2;
  int i_1;
  int j;
  int local_24;
  int i;
  FILE *f;
  string *file_local;
  Bmp *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"rb");
  fread(&this->m_bf,1,0xe,__stream);
  fread(&this->m_bi,1,0x28,__stream);
  this->m_w = (this->m_bi).biWidth;
  this->m_h = (this->m_bi).biHeight;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->m_w;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppBVar4 = (BmpColor **)operator_new__(uVar3);
  this->m_data = ppBVar4;
  for (local_24 = 0; local_24 < this->m_w; local_24 = local_24 + 1) {
    uVar3 = (ulong)this->m_h;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar5 = SUB168(auVar2 * ZEXT816(3),0);
    if (SUB168(auVar2 * ZEXT816(3),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pBVar6 = (BmpColor *)operator_new__(uVar5);
    if (uVar3 != 0) {
      local_60 = pBVar6;
      do {
        BmpColor::BmpColor(local_60);
        local_60 = local_60 + 1;
      } while (local_60 != pBVar6 + uVar3);
    }
    this->m_data[local_24] = pBVar6;
  }
  i_2 = this->m_h;
  while (i_2 = i_2 + -1, -1 < i_2) {
    for (local_3c = 0; local_3c < this->m_w; local_3c = local_3c + 1) {
      fread(&this->m_data[local_3c][i_2].b,1,1,__stream);
      fread(&this->m_data[local_3c][i_2].g,1,1,__stream);
      fread(this->m_data[local_3c] + i_2,1,1,__stream);
    }
    for (local_40 = 0; local_40 < this->m_w % 4; local_40 = local_40 + 1) {
      fgetc(__stream);
    }
  }
  fclose(__stream);
  return;
}

Assistant:

Bmp::Bmp(const std::string& file)
{
    FILE* f = fopen(file.c_str(), "rb");

    fread(&m_bf, 1, sizeof(BITMAPFILEHEADER), f);
    fread(&m_bi, 1, sizeof(BITMAPINFOHEADER), f);

    m_w = m_bi.biWidth, m_h = m_bi.biHeight;
    m_data = new BmpColor*[m_w];
    for (int i = 0; i < m_w; i++) m_data[i] = new BmpColor[m_h];

    for (int j = m_h - 1; j >= 0; j--)
    {
        for (int i = 0; i < m_w; i++)
        {
            fread(&m_data[i][j].b, 1, sizeof(byte), f);
            fread(&m_data[i][j].g, 1, sizeof(byte), f);
            fread(&m_data[i][j].r, 1, sizeof(byte), f);
        }
        for (int i = 0; i < m_w % 4; i++) fgetc(f);
    }

    fclose(f);
}